

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void rsa2_sign(ssh_key *key,ptrlen data,uint flags,BinarySink *bs)

{
  BinarySink *bs_00;
  uint8_t val;
  size_t sVar1;
  ptrlen pVar2;
  mp_int *local_88;
  size_t i;
  ssh2_rsa_extra *extra;
  char *sign_alg_name;
  ssh_hashalg *halg;
  mp_int *out;
  mp_int *in;
  size_t nbytes;
  uchar *bytes;
  RSAKey *rsa;
  BinarySink *bs_local;
  ssh_key *psStack_20;
  uint flags_local;
  ssh_key *key_local;
  ptrlen data_local;
  
  data_local.ptr = (void *)data.len;
  key_local = (ssh_key *)data.ptr;
  bytes = (uchar *)(key + -8);
  bs_local._4_4_ = *key->vt->extra | flags;
  rsa = (RSAKey *)bs;
  psStack_20 = key;
  sign_alg_name = (char *)rsa2_hash_alg_for_flags(bs_local._4_4_,(char **)&extra);
  sVar1 = mp_get_nbits(*(mp_int **)(bytes + 8));
  in = (mp_int *)(sVar1 + 7 >> 3);
  pVar2.len = (size_t)data_local.ptr;
  pVar2.ptr = key_local;
  nbytes = (size_t)rsa_pkcs1_signature_string((size_t)in,(ssh_hashalg *)sign_alg_name,pVar2);
  pVar2 = make_ptrlen((void *)nbytes,(size_t)in);
  out = mp_from_bytes_be(pVar2);
  smemclr((void *)nbytes,(size_t)in);
  safefree((void *)nbytes);
  halg = (ssh_hashalg *)rsa_privkey_op(out,(RSAKey *)bytes);
  mp_free(out);
  BinarySink_put_stringz((BinarySink *)rsa->exponent,(char *)extra);
  sVar1 = mp_get_nbits((mp_int *)halg);
  in = (mp_int *)(sVar1 + 7 >> 3);
  BinarySink_put_uint32((BinarySink *)rsa->exponent,(unsigned_long)in);
  for (local_88 = (mp_int *)0x0; local_88 < in; local_88 = (mp_int *)((long)&local_88->nw + 1)) {
    bs_00 = (BinarySink *)rsa->exponent;
    val = mp_get_byte((mp_int *)halg,(long)in + (-1 - (long)local_88));
    BinarySink_put_byte(bs_00,val);
  }
  mp_free((mp_int *)halg);
  return;
}

Assistant:

static void rsa2_sign(ssh_key *key, ptrlen data,
                      unsigned flags, BinarySink *bs)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    unsigned char *bytes;
    size_t nbytes;
    mp_int *in, *out;
    const ssh_hashalg *halg;
    const char *sign_alg_name;

    const struct ssh2_rsa_extra *extra =
        (const struct ssh2_rsa_extra *)key->vt->extra;
    flags |= extra->signflags;

    halg = rsa2_hash_alg_for_flags(flags, &sign_alg_name);

    nbytes = (mp_get_nbits(rsa->modulus) + 7) / 8;

    bytes = rsa_pkcs1_signature_string(nbytes, halg, data);
    in = mp_from_bytes_be(make_ptrlen(bytes, nbytes));
    smemclr(bytes, nbytes);
    sfree(bytes);

    out = rsa_privkey_op(in, rsa);
    mp_free(in);

    put_stringz(bs, sign_alg_name);
    nbytes = (mp_get_nbits(out) + 7) / 8;
    put_uint32(bs, nbytes);
    for (size_t i = 0; i < nbytes; i++)
        put_byte(bs, mp_get_byte(out, nbytes - 1 - i));

    mp_free(out);
}